

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

void __thiscall ON_OffsetSurface::~ON_OffsetSurface(ON_OffsetSurface *this)

{
  ~ON_OffsetSurface(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

ON_OffsetSurface::~ON_OffsetSurface()
{
  m_offset_function.SetBaseSurface( 0 );
  if ( 0 != m__pSrf && this != m__pSrf )
    delete m__pSrf;
  m__pSrf = 0;
  
}